

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

ON_Interval __thiscall ON_Evaluator::Domain(ON_Evaluator *this,int parameter_index)

{
  ON_Interval *pOVar1;
  ON_Interval OVar2;
  ON_Interval local_18;
  
  if ((this->m_parameter_count < 1) || (this->m_parameter_count != (this->m_domain).m_count)) {
    ON_Interval::ON_Interval(&local_18,-1e+300,1e+300);
  }
  else {
    pOVar1 = (this->m_domain).m_a + parameter_index;
    local_18.m_t[0] = pOVar1->m_t[0];
    local_18.m_t[1] = pOVar1->m_t[1];
  }
  OVar2.m_t[0] = local_18.m_t[0];
  OVar2.m_t[1] = local_18.m_t[1];
  return (ON_Interval)OVar2.m_t;
}

Assistant:

ON_Interval ON_Evaluator::Domain(
  int parameter_index
  ) const
{
  return ((m_parameter_count==m_domain.Count() && m_parameter_count>0) 
          ? m_domain[parameter_index] 
          : ON_Interval(-1.0e300,1.0e300)
          );
}